

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

Token * __thiscall inja::Lexer::scan_string(Token *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  const_reference pcVar5;
  char ch;
  bool escape;
  Lexer *this_local;
  
  bVar3 = false;
  while (uVar2 = this->m_pos,
        sVar4 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::size(&this->m_in)
        , uVar2 < sVar4) {
    sVar4 = this->m_pos;
    this->m_pos = sVar4 + 1;
    pcVar5 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::operator[]
                       (&this->m_in,sVar4);
    cVar1 = *pcVar5;
    if (cVar1 == '\\') {
      bVar3 = true;
    }
    else {
      if ((!bVar3) &&
         (pcVar5 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             (&this->m_in,this->m_tok_start), cVar1 == *pcVar5)) break;
      bVar3 = false;
    }
  }
  make_token(__return_storage_ptr__,this,String);
  return __return_storage_ptr__;
}

Assistant:

Token scan_string() {
		bool escape{false};
		for (;;) {
			if (m_pos >= m_in.size()) break;
			char ch = m_in[m_pos++];
			if (ch == '\\') {
				escape = true;
			} else if (!escape && ch == m_in[m_tok_start]) {
				break;
			} else {
				escape = false;
			}
		}
		return make_token(Token::Kind::String);
	}